

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

bool __thiscall
rapidjson::
Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteInt(Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           *this,int i)

{
  char *pcVar1;
  char *p;
  char *buffer_00;
  char buffer [11];
  char local_23 [11];
  
  buffer_00 = local_23;
  pcVar1 = internal::i32toa(i,buffer_00);
  for (; buffer_00 != pcVar1; buffer_00 = buffer_00 + 1) {
    BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>::Put
              (this->os_,*buffer_00);
  }
  return true;
}

Assistant:

bool WriteInt(int i) {
        char buffer[11];
        const char* end = internal::i32toa(i, buffer);
        PutReserve(*os_, static_cast<size_t>(end - buffer));
        for (const char* p = buffer; p != end; ++p)
            PutUnsafe(*os_, static_cast<typename OutputStream::Ch>(*p));
        return true;
    }